

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O2

int update_it_envelope(IT_PLAYING *playing,IT_ENVELOPE *envelope,IT_PLAYING_ENVELOPE *pe,int flags)

{
  char cVar1;
  byte bVar2;
  ushort uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  
  if (((uint)playing->enabled_envelopes & flags) == 0) {
    return 0;
  }
  if (envelope->n_nodes == 0) {
    return 0;
  }
  uVar4 = pe->tick;
  if ((int)uVar4 < 1) {
    cVar1 = envelope->node_y[0];
  }
  else {
    uVar5 = envelope->n_nodes - 1;
    if (uVar4 < envelope->node_t[uVar5]) {
      lVar7 = (long)pe->next_node;
      iVar6 = envelope->node_y[lVar7 + -1] * 0x100;
      uVar3 = envelope->node_t[lVar7 + -1];
      if (uVar3 != envelope->node_t[lVar7]) {
        iVar6 = iVar6 + (int)((uVar4 - uVar3) *
                              ((int)envelope->node_y[lVar7] - (int)envelope->node_y[lVar7 + -1]) *
                             0x100) / (int)((uint)envelope->node_t[lVar7] - (uint)uVar3);
      }
      goto LAB_005860e8;
    }
    cVar1 = envelope->node_y[uVar5];
  }
  iVar6 = (int)cVar1 << 8;
LAB_005860e8:
  pe->value = iVar6;
  pe->tick = uVar4 + 1;
  recalculate_it_envelope_node(pe,envelope);
  if (((envelope->flags & 4) == 0) || ((playing->flags & 2) != 0)) {
    if ((envelope->flags & 2) == 0) {
      if (pe->tick <= (int)(uint)envelope->node_t[(ulong)envelope->n_nodes - 1]) {
        return 0;
      }
      return 1;
    }
    if (pe->tick <= (int)(uint)envelope->node_t[envelope->loop_end]) {
      return 0;
    }
    bVar2 = envelope->loop_start;
  }
  else {
    if (pe->tick <= (int)(uint)envelope->node_t[envelope->sus_loop_end]) {
      return 0;
    }
    bVar2 = envelope->sus_loop_start;
  }
  pe->next_node = bVar2 + 1;
  pe->tick = (uint)envelope->node_t[bVar2];
  return 0;
}

Assistant:

static int update_it_envelope(IT_PLAYING *playing, IT_ENVELOPE *envelope, IT_PLAYING_ENVELOPE *pe, int flags)
{
	if (!(playing->enabled_envelopes & flags) || !envelope->n_nodes)
		return 0;

	ASSERT(envelope->n_nodes > 0);

	if (pe->tick <= 0)
		pe->value = envelope->node_y[0] << IT_ENVELOPE_SHIFT;
	else if (pe->tick >= envelope->node_t[envelope->n_nodes-1]) {
		pe->value = envelope->node_y[envelope->n_nodes-1] << IT_ENVELOPE_SHIFT;
	} else {
		int ys = envelope->node_y[pe->next_node-1] << IT_ENVELOPE_SHIFT;
		int ts = envelope->node_t[pe->next_node-1];
		int te = envelope->node_t[pe->next_node];

		if (ts == te)
			pe->value = ys;
		else {
			int ye = envelope->node_y[pe->next_node] << IT_ENVELOPE_SHIFT;
			int t = pe->tick;

			pe->value = ys + (ye - ys) * (t - ts) / (te - ts);
		}
	}

	pe->tick++;

	recalculate_it_envelope_node(pe, envelope);

	if ((envelope->flags & IT_ENVELOPE_SUSTAIN_LOOP) && !(playing->flags & IT_PLAYING_SUSTAINOFF)) {
		if (pe->tick > envelope->node_t[envelope->sus_loop_end]) {
			pe->next_node = envelope->sus_loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->sus_loop_start];
			return 0;
		}
	} else if (envelope->flags & IT_ENVELOPE_LOOP_ON) {
		if (pe->tick > envelope->node_t[envelope->loop_end]) {
			pe->next_node = envelope->loop_start + 1;
			ASSERT(pe->next_node <= envelope->n_nodes);
			pe->tick = envelope->node_t[envelope->loop_start];
			return 0;
		}
	}
	else if (pe->tick > envelope->node_t[envelope->n_nodes - 1])
		return 1;

	return 0;
}